

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::BeginMainMenuBar(void)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  bool bVar3;
  float fVar4;
  ImVec2 local_28;
  ImVec2 local_20;
  
  pIVar1 = GImGui;
  fVar4 = (GImGui->Style).DisplaySafeAreaPadding.y - (GImGui->Style).FramePadding.y;
  (GImGui->NextWindowData).MenuBarOffsetMinVal.x = (GImGui->Style).DisplaySafeAreaPadding.x;
  (pIVar1->NextWindowData).MenuBarOffsetMinVal.y = (float)(-(uint)(0.0 <= fVar4) & (uint)fVar4);
  bVar3 = false;
  local_28.x = 0.0;
  local_28.y = 0.0;
  local_20.x = 0.0;
  local_20.y = 0.0;
  SetNextWindowPos(&local_28,0,&local_20);
  local_28.y = (pIVar1->NextWindowData).MenuBarOffsetMinVal.y + pIVar1->FontBaseSize +
               (pIVar1->Style).FramePadding.y;
  local_28.x = (pIVar1->IO).DisplaySize.x;
  SetNextWindowSize(&local_28,0);
  PushStyleVar(2,0.0);
  local_28.x = 0.0;
  local_28.y = 0.0;
  PushStyleVar(4,&local_28);
  bVar2 = Begin("##MainMenuBar",(bool *)0x0,0x50f);
  if (bVar2) {
    bVar3 = BeginMenuBar();
  }
  PopStyleVar(2);
  (pIVar1->NextWindowData).MenuBarOffsetMinVal.x = 0.0;
  (pIVar1->NextWindowData).MenuBarOffsetMinVal.y = 0.0;
  if (bVar3 == false) {
    End();
  }
  return bVar3;
}

Assistant:

bool ImGui::BeginMainMenuBar()
{
    ImGuiContext& g = *GImGui;
    g.NextWindowData.MenuBarOffsetMinVal = ImVec2(g.Style.DisplaySafeAreaPadding.x, ImMax(g.Style.DisplaySafeAreaPadding.y - g.Style.FramePadding.y, 0.0f));
    SetNextWindowPos(ImVec2(0.0f, 0.0f));
    SetNextWindowSize(ImVec2(g.IO.DisplaySize.x, g.NextWindowData.MenuBarOffsetMinVal.y + g.FontBaseSize + g.Style.FramePadding.y));
    PushStyleVar(ImGuiStyleVar_WindowRounding, 0.0f);
    PushStyleVar(ImGuiStyleVar_WindowMinSize, ImVec2(0,0));
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoScrollbar | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_MenuBar;
    bool is_open = Begin("##MainMenuBar", NULL, window_flags) && BeginMenuBar();
    PopStyleVar(2);
    g.NextWindowData.MenuBarOffsetMinVal = ImVec2(0.0f, 0.0f);
    if (!is_open)
    {
        End();
        return false;
    }
    return true;
}